

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VtabFinishParse(Parse *pParse,Token *pEnd)

{
  Table *data;
  sqlite3 *db;
  Schema *pSVar1;
  long *plVar2;
  int *piVar3;
  undefined8 *puVar4;
  int addr;
  int iVar5;
  HashElem *pHVar6;
  size_t sVar7;
  Parse *pPVar8;
  char *pcVar9;
  Vdbe *p;
  char *pcVar10;
  void *pvVar11;
  Schema **ppSVar12;
  int p2;
  ulong local_50;
  
  data = pParse->pNewTable;
  if (data != (Table *)0x0) {
    db = pParse->db;
    addArgumentToVtab(pParse);
    (pParse->sArg).z = (char *)0x0;
    if (0 < (data->u).tab.addColOffset) {
      if ((db->init).busy == '\0') {
        pPVar8 = pParse->pToplevel;
        if (pParse->pToplevel == (Parse *)0x0) {
          pPVar8 = pParse;
        }
        pPVar8->mayAbort = '\x01';
        if (pEnd != (Token *)0x0) {
          (pParse->sNameToken).n = (*(int *)&pEnd->z - *(int *)&(pParse->sNameToken).z) + pEnd->n;
        }
        pcVar9 = sqlite3MPrintf(db,"CREATE VIRTUAL TABLE %T",&pParse->sNameToken);
        if (data->pSchema == (Schema *)0x0) {
          iVar5 = -0x8000;
        }
        else {
          iVar5 = -1;
          ppSVar12 = &db->aDb->pSchema;
          do {
            iVar5 = iVar5 + 1;
            pSVar1 = *ppSVar12;
            ppSVar12 = ppSVar12 + 4;
          } while (pSVar1 != data->pSchema);
        }
        sqlite3NestedParse(pParse,
                           "UPDATE %Q.sqlite_master SET type=\'table\', name=%Q, tbl_name=%Q, rootpage=0, sql=%Q WHERE rowid=#%d"
                           ,db->aDb[iVar5].zDbSName,data->zName,data->zName,pcVar9,pParse->regRowid)
        ;
        p = sqlite3GetVdbe(pParse);
        sqlite3VdbeAddOp3(pParse->pVdbe,100,iVar5,1,
                          (pParse->db->aDb[iVar5].pSchema)->schema_cookie + 1);
        sqlite3VdbeAddOp3(p,0xa6,0,0,0);
        pcVar10 = sqlite3MPrintf(db,"name=%Q AND sql=%Q",data->zName);
        sqlite3VdbeAddParseSchemaOp(p,iVar5,pcVar10,0);
        if (pcVar9 != (char *)0x0) {
          sqlite3DbFreeNN(db,pcVar9);
        }
        p2 = pParse->nMem + 1;
        pParse->nMem = p2;
        pcVar9 = data->zName;
        addr = sqlite3VdbeAddOp3(p,0x75,0,p2,0);
        sqlite3VdbeChangeP4(p,addr,pcVar9,0);
        sqlite3VdbeAddOp3(p,0xab,iVar5,p2,0);
        return;
      }
      pSVar1 = data->pSchema;
      pcVar9 = data->zName;
      pHVar6 = findElementWithHash(&db->aModule,*(data->u).vtab.azArg,(uint *)0x0);
      plVar2 = (long *)pHVar6->data;
      if ((((plVar2 != (long *)0x0) && (piVar3 = (int *)*plVar2, piVar3 != (int *)0x0)) &&
          (2 < *piVar3)) && (*(long *)(piVar3 + 0x2e) != 0)) {
        if (pcVar9 == (char *)0x0) {
          local_50 = 0;
        }
        else {
          sVar7 = strlen(pcVar9);
          local_50 = (ulong)((uint)sVar7 & 0x3fffffff);
        }
        for (pHVar6 = (pSVar1->tblHash).first; pHVar6 != (HashElem *)0x0; pHVar6 = pHVar6->next) {
          puVar4 = (undefined8 *)pHVar6->data;
          if ((*(char *)((long)puVar4 + 0x3f) == '\0') &&
             ((*(byte *)((long)puVar4 + 0x31) & 0x10) == 0)) {
            pcVar10 = (char *)*puVar4;
            iVar5 = sqlite3_strnicmp(pcVar10,data->zName,(int)local_50);
            if ((iVar5 == 0) &&
               ((pcVar10[local_50] == '_' &&
                (iVar5 = (**(code **)(*plVar2 + 0xb8))(pcVar10 + local_50 + 1), iVar5 != 0)))) {
              *(byte *)((long)puVar4 + 0x31) = *(byte *)((long)puVar4 + 0x31) | 0x10;
            }
          }
        }
      }
      pvVar11 = sqlite3HashInsert(&pSVar1->tblHash,pcVar9,data);
      if (pvVar11 != (void *)0x0) {
        sqlite3OomFault(db);
        return;
      }
      pParse->pNewTable = (Table *)0x0;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VtabFinishParse(Parse *pParse, Token *pEnd){
  Table *pTab = pParse->pNewTable;  /* The table being constructed */
  sqlite3 *db = pParse->db;         /* The database connection */

  if( pTab==0 ) return;
  assert( IsVirtual(pTab) );
  addArgumentToVtab(pParse);
  pParse->sArg.z = 0;
  if( pTab->u.vtab.nArg<1 ) return;

  /* If the CREATE VIRTUAL TABLE statement is being entered for the
  ** first time (in other words if the virtual table is actually being
  ** created now instead of just being read out of sqlite_schema) then
  ** do additional initialization work and store the statement text
  ** in the sqlite_schema table.
  */
  if( !db->init.busy ){
    char *zStmt;
    char *zWhere;
    int iDb;
    int iReg;
    Vdbe *v;

    sqlite3MayAbort(pParse);

    /* Compute the complete text of the CREATE VIRTUAL TABLE statement */
    if( pEnd ){
      pParse->sNameToken.n = (int)(pEnd->z - pParse->sNameToken.z) + pEnd->n;
    }
    zStmt = sqlite3MPrintf(db, "CREATE VIRTUAL TABLE %T", &pParse->sNameToken);

    /* A slot for the record has already been allocated in the
    ** schema table.  We just need to update that slot with all
    ** the information we've collected.
    **
    ** The VM register number pParse->regRowid holds the rowid of an
    ** entry in the sqlite_schema table tht was created for this vtab
    ** by sqlite3StartTable().
    */
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    sqlite3NestedParse(pParse,
      "UPDATE %Q." LEGACY_SCHEMA_TABLE " "
         "SET type='table', name=%Q, tbl_name=%Q, rootpage=0, sql=%Q "
       "WHERE rowid=#%d",
      db->aDb[iDb].zDbSName,
      pTab->zName,
      pTab->zName,
      zStmt,
      pParse->regRowid
    );
    v = sqlite3GetVdbe(pParse);
    sqlite3ChangeCookie(pParse, iDb);

    sqlite3VdbeAddOp0(v, OP_Expire);
    zWhere = sqlite3MPrintf(db, "name=%Q AND sql=%Q", pTab->zName, zStmt);
    sqlite3VdbeAddParseSchemaOp(v, iDb, zWhere, 0);
    sqlite3DbFree(db, zStmt);

    iReg = ++pParse->nMem;
    sqlite3VdbeLoadString(v, iReg, pTab->zName);
    sqlite3VdbeAddOp2(v, OP_VCreate, iDb, iReg);
  }else{
    /* If we are rereading the sqlite_schema table create the in-memory
    ** record of the table. */
    Table *pOld;
    Schema *pSchema = pTab->pSchema;
    const char *zName = pTab->zName;
    assert( zName!=0 );
    sqlite3MarkAllShadowTablesOf(db, pTab);
    pOld = sqlite3HashInsert(&pSchema->tblHash, zName, pTab);
    if( pOld ){
      sqlite3OomFault(db);
      assert( pTab==pOld );  /* Malloc must have failed inside HashInsert() */
      return;
    }
    pParse->pNewTable = 0;
  }
}